

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

EnumValueOptions * __thiscall
google::protobuf::EnumValueDescriptorProto::_internal_mutable_options
          (EnumValueDescriptorProto *this)

{
  uint32_t *puVar1;
  Arena *arena;
  EnumValueOptions *pEVar2;
  EnumValueOptions *p;
  EnumValueDescriptorProto *this_local;
  
  puVar1 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  *puVar1 = *puVar1 | 2;
  if (this->options_ == (EnumValueOptions *)0x0) {
    arena = MessageLite::GetArenaForAllocation((MessageLite *)this);
    pEVar2 = MessageLite::CreateMaybeMessage<google::protobuf::EnumValueOptions>(arena);
    this->options_ = pEVar2;
  }
  return this->options_;
}

Assistant:

inline ::PROTOBUF_NAMESPACE_ID::EnumValueOptions* EnumValueDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000002u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<::PROTOBUF_NAMESPACE_ID::EnumValueOptions>(GetArenaForAllocation());
    options_ = p;
  }
  return options_;
}